

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  SPIRType *type;
  runtime_error *prVar5;
  uint32_t uVar6;
  char (*in_R8) [2];
  string *in_R9;
  string *ts_3;
  char **in_stack_fffffffffffffc58;
  char *store_op;
  uint32_t local_398;
  uint32_t local_394;
  string bitcast_op;
  uint local_364;
  SPIRAccessChain *local_360;
  SmallVector<unsigned_int,_8UL> *local_358;
  string local_350;
  string template_expr;
  string base;
  SPIRType scalar_type;
  SPIRType target_type;
  
  local_394 = value;
  local_358 = composite_chain;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(chain->super_IVariant).field_0xc);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  bVar3 = Compiler::is_scalar((Compiler *)this,type);
  target_type.super_IVariant._12_4_ = 0x15;
  if (!bVar3) {
    target_type.super_IVariant._12_4_ = *(undefined4 *)&(type->super_IVariant).field_0xc;
  }
  target_type.array.super_VectorView<unsigned_int>.ptr = (uint *)&target_type.array.stack_storage;
  target_type.super_IVariant.self.id = 0;
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.array.buffer_capacity = 8;
  target_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&target_type.array_size_literal.stack_storage;
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  target_type.array_size_literal.buffer_capacity = 8;
  target_type.pointer_depth = 0;
  target_type.pointer = false;
  target_type.forward_pointer = false;
  target_type.cooperative.use_id = 0;
  target_type.cooperative.rows_id = 0;
  target_type.cooperative.columns_id = 0;
  target_type.cooperative.scope_id = 0;
  target_type.storage = Generic;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&target_type.member_types.stack_storage;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  target_type.member_types.buffer_capacity = 8;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&target_type.member_type_index_redirection.stack_storage;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.member_type_index_redirection.buffer_capacity = 8;
  target_type.member_name_cache._M_h._M_buckets =
       &target_type.member_name_cache._M_h._M_single_bucket;
  target_type.image._0_7_ = 0;
  target_type.image._7_4_ = 0;
  target_type.image.sampled = 0;
  target_type.image.format = ImageFormatUnknown;
  target_type.image.access = AccessQualifierReadOnly;
  target_type.type_alias.id = 0;
  target_type.parent_type.id = 0;
  target_type.member_name_cache._M_h._M_bucket_count = 1;
  target_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  target_type.member_name_cache._M_h._M_element_count = 0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  target_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  target_type.basetype = UInt;
  target_type.width = 0;
  target_type.vecsize = type->vecsize;
  target_type.columns = type->columns;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (type->basetype != Struct) {
      if ((type->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar5,
                   "Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                  );
        *(undefined ***)prVar5 = &PTR__runtime_error_0049deb0;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_398 = (this->hlsl_options).shader_model;
      base._M_dataplus._M_p = (pointer)&base.field_2;
      pcVar2 = (chain->base)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&base,pcVar2,pcVar2 + (chain->base)._M_string_length);
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar3) {
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
      }
      template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
      template_expr._M_string_length = 0;
      template_expr.field_2._M_local_buf[0] = '\0';
      if (0x3d < local_398) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&bitcast_op,this,type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)0x361f9d,(char (*) [2])&bitcast_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
        if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
          operator_delete(scalar_type.super_IVariant._vptr_IVariant);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
            &bitcast_op.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                   (int)bitcast_op._M_dataplus._M_p));
        }
      }
      local_360 = chain;
      if (type->columns == 1) {
        if (chain->row_major_matrix == false) {
          store_op = (char *)0x0;
          switch(type->vecsize) {
          case 1:
            store_op = "Store";
            break;
          case 2:
            store_op = "Store2";
            break;
          case 3:
            store_op = "Store3";
            break;
          case 4:
            store_op = "Store4";
            break;
          default:
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar5,"Unknown vector size.");
            *(undefined ***)prVar5 = &PTR__runtime_error_0049deb0;
            __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          write_access_chain_value_abi_cxx11_((string *)&scalar_type,this,local_394,local_358,false)
          ;
          if (local_398 < 0x3e) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (&bitcast_op,this,&target_type,type);
            if (bitcast_op._M_string_length != 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_350,(spirv_cross *)&bitcast_op,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3a67d9,(char (*) [2])&scalar_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3b224b,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_350);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
          }
          else {
            store_op = "Store";
          }
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&base,(char (*) [2])0x35dc3b,&store_op,&template_expr
                     ,(char (*) [2])0x3a67d9,&chain->dynamic_index,&chain->static_index,
                     (char (*) [3])0x3a2bb2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scalar_type,(char (*) [3])0x3b1288);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
        }
        else {
          if (0x3d < local_398) {
            SPIRType::SPIRType(&scalar_type,type);
            scalar_type.vecsize = 1;
            scalar_type.columns = 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_350,this,&scalar_type,0);
            join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                      (&bitcast_op,(spirv_cross *)0x361f9d,(char (*) [2])&local_350,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f
                       ,in_R8);
            ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p);
            }
            scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&scalar_type.member_name_cache._M_h);
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0
            ;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &scalar_type.member_type_index_redirection.stack_storage) {
              free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                scalar_type.member_types.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
                &scalar_type.member_types.stack_storage) {
              free(scalar_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)
                scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
                &scalar_type.array_size_literal.stack_storage) {
              free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                scalar_type.array.super_VectorView<unsigned_int>.ptr !=
                &scalar_type.array.stack_storage) {
              free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
          if (type->vecsize != 0) {
            psVar1 = &local_360->dynamic_index;
            uVar6 = 0;
            do {
              write_access_chain_value_abi_cxx11_
                        ((string *)&scalar_type,this,local_394,local_358,true);
              if (1 < type->vecsize) {
                ::std::__cxx11::string::append((char *)&scalar_type);
                CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar6);
                ::std::__cxx11::string::append((char *)&scalar_type);
              }
              CompilerGLSL::remove_duplicate_swizzle
                        (&this->super_CompilerGLSL,(string *)&scalar_type);
              if (local_398 < 0x3e) {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                          (&bitcast_op,this,&target_type,type);
                if (bitcast_op._M_string_length != 0) {
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&local_350,(spirv_cross *)&bitcast_op,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3a67d9,(char (*) [2])&scalar_type,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3b224b,(char (*) [2])in_R9);
                  ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_350);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p != &local_350.field_2) {
                    operator_delete(local_350._M_dataplus._M_p);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
              }
              bitcast_op._M_dataplus._M_p._0_4_ =
                   local_360->matrix_stride * uVar6 + local_360->static_index;
              in_R9 = psVar1;
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                         (char (*) [2])0x3a67d9,psVar1,(uint *)&bitcast_op,(char (*) [3])0x3a2bb2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalar_type,(char (*) [3])0x3b1288);
              if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype)
              {
                operator_delete(scalar_type.super_IVariant._vptr_IVariant);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < type->vecsize);
          }
        }
      }
      else if (chain->row_major_matrix == false) {
        store_op = (char *)0x0;
        switch(type->vecsize) {
        case 1:
          store_op = "Store";
          break;
        case 2:
          store_op = "Store2";
          break;
        case 3:
          store_op = "Store3";
          break;
        case 4:
          store_op = "Store4";
          break;
        default:
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar5,"Unknown vector size.");
          *(undefined ***)prVar5 = &PTR__runtime_error_0049deb0;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (0x3d < local_398) {
          store_op = "Store";
          SPIRType::SPIRType(&scalar_type,type);
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_350,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x361f9d,(char (*) [2])&local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
              &bitcast_op.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                     (int)bitcast_op._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p);
          }
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&scalar_type.member_name_cache._M_h);
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.member_type_index_redirection.stack_storage) {
            free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              scalar_type.member_types.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
              &scalar_type.member_types.stack_storage) {
            free(scalar_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr
              != &scalar_type.array_size_literal.stack_storage) {
            free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.array.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.array.stack_storage) {
            free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
          }
        }
        local_364 = 0;
        if (type->columns != 0) {
          psVar1 = &local_360->dynamic_index;
          do {
            write_access_chain_value_abi_cxx11_(&bitcast_op,this,local_394,local_358,true);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x391742
                       ,(char (*) [2])&local_364,(uint *)0x391647,(char (*) [2])in_R9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
            if (local_398 < 0x3e) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                        (&bitcast_op,this,&target_type,type);
              if (bitcast_op._M_string_length != 0) {
                join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                          (&local_350,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3a67d9,(char (*) [2])&scalar_type,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3b224b,(char (*) [2])in_R9);
                ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                  &bitcast_op.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                         (int)bitcast_op._M_dataplus._M_p));
              }
            }
            bitcast_op._M_dataplus._M_p._0_4_ =
                 local_360->matrix_stride * local_364 + local_360->static_index;
            in_R9 = (string *)0x3a67d9;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&base,(char (*) [2])0x35dc3b,&store_op,
                       &template_expr,(char (*) [2])0x3a67d9,psVar1,(uint *)&bitcast_op,
                       (char (*) [3])0x3a2bb2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scalar_type,(char (*) [3])0x3b1288);
            if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
              operator_delete(scalar_type.super_IVariant._vptr_IVariant);
            }
            local_364 = local_364 + 1;
          } while (local_364 < type->columns);
        }
      }
      else {
        if (0x3d < local_398) {
          SPIRType::SPIRType(&scalar_type,type);
          scalar_type.vecsize = 1;
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_350,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x361f9d,(char (*) [2])&local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
              &bitcast_op.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                     (int)bitcast_op._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p);
          }
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&scalar_type.member_name_cache._M_h);
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.member_type_index_redirection.stack_storage) {
            free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              scalar_type.member_types.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
              &scalar_type.member_types.stack_storage) {
            free(scalar_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr
              != &scalar_type.array_size_literal.stack_storage) {
            free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.array.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.array.stack_storage) {
            free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
          }
        }
        if (type->vecsize != 0) {
          psVar1 = &local_360->dynamic_index;
          uVar6 = 0;
          do {
            store_op = (char *)((ulong)store_op & 0xffffffff00000000);
            if (type->columns != 0) {
              do {
                write_access_chain_value_abi_cxx11_(&bitcast_op,this,local_394,local_358,true);
                local_350._M_dataplus._M_p =
                     CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar6);
                ts_3 = &local_350;
                join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],char_const*>
                          ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x391742,(char (*) [2])&store_op,(uint *)0x3b26a1,
                           (char (*) [3])&local_350,in_stack_fffffffffffffc58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
                CompilerGLSL::remove_duplicate_swizzle
                          (&this->super_CompilerGLSL,(string *)&scalar_type);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                          (&bitcast_op,this,&target_type,type);
                if (bitcast_op._M_string_length != 0) {
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&local_350,(spirv_cross *)&bitcast_op,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3a67d9,(char (*) [2])&scalar_type,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3b224b,(char (*) [2])ts_3);
                  ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_350);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p != &local_350.field_2) {
                    operator_delete(local_350._M_dataplus._M_p);
                  }
                }
                local_350._M_dataplus._M_p._0_4_ =
                     local_360->matrix_stride * uVar6 +
                     (type->width >> 3) * (int)store_op + local_360->static_index;
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                           (char (*) [2])0x3a67d9,psVar1,(uint *)&local_350,(char (*) [3])0x3a2bb2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalar_type,(char (*) [3])0x3b1288);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
                if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype
                   ) {
                  operator_delete(scalar_type.super_IVariant._vptr_IVariant);
                }
                uVar4 = (int)store_op + 1;
                store_op = (char *)CONCAT44(store_op._4_4_,uVar4);
              } while (uVar4 < type->columns);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < type->vecsize);
        }
      }
      Compiler::register_write((Compiler *)this,(local_360->super_IVariant).self.id);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)template_expr._M_dataplus._M_p != &template_expr.field_2) {
        operator_delete(template_expr._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base._M_dataplus._M_p != &base.field_2) {
        operator_delete(base._M_dataplus._M_p);
      }
      goto LAB_001e2fd6;
    }
    write_access_chain_struct(this,chain,local_394,local_358);
  }
  else {
    write_access_chain_array(this,chain,local_394,local_358);
  }
  Compiler::register_write((Compiler *)this,(chain->super_IVariant).self.id);
LAB_001e2fd6:
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&target_type.member_name_cache._M_h);
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &target_type.member_type_index_redirection.stack_storage) {
    free(target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &target_type.member_types.stack_storage) {
    free(target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        );
  }
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)target_type.array_size_literal.super_VectorView<bool>.ptr !=
      &target_type.array_size_literal.stack_storage) {
    free(target_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)target_type.array.super_VectorView<unsigned_int>.ptr !=
      &target_type.array.stack_storage) {
    free(target_type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::write_access_chain(const SPIRAccessChain &chain, uint32_t value,
                                      const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Make sure we trigger a read of the constituents in the access chain.
	track_expression_read(chain.self);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		write_access_chain_array(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		write_access_chain_struct(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_store = hlsl_options.shader_model >= 62;

	auto base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	string template_expr;
	if (templated_store)
		template_expr = join("<", type_to_glsl(type), ">");

	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		auto store_expr = write_access_chain_value(value, composite_chain, false);

		if (!templated_store)
		{
			auto bitcast_op = bitcast_glsl_op(target_type, type);
			if (!bitcast_op.empty())
				store_expr = join(bitcast_op, "(", store_expr, ")");
		}
		else
			store_op = "Store";
		statement(base, ".", store_op, template_expr, "(", chain.dynamic_index, chain.static_index, ", ",
		          store_expr, ");");
	}
	else if (type.columns == 1)
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		// Strided store.
		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			auto store_expr = write_access_chain_value(value, composite_chain, true);
			if (type.vecsize > 1)
			{
				store_expr += ".";
				store_expr += index_to_swizzle(r);
			}
			remove_duplicate_swizzle(store_expr);

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".Store", template_expr, "(", chain.dynamic_index,
			          chain.static_index + chain.matrix_stride * r, ", ", store_expr, ");");
		}
	}
	else if (!chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_store)
		{
			store_op = "Store";
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
		}

		for (uint32_t c = 0; c < type.columns; c++)
		{
			auto store_expr = join(write_access_chain_value(value, composite_chain, true), "[", c, "]");

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".", store_op, template_expr, "(", chain.dynamic_index,
			          chain.static_index + c * chain.matrix_stride, ", ", store_expr, ");");
		}
	}
	else
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			for (uint32_t c = 0; c < type.columns; c++)
			{
				auto store_expr =
				    join(write_access_chain_value(value, composite_chain, true), "[", c, "].", index_to_swizzle(r));
				remove_duplicate_swizzle(store_expr);
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
				statement(base, ".Store", template_expr, "(", chain.dynamic_index,
				          chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ", ", store_expr, ");");
			}
		}
	}

	register_write(chain.self);
}